

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketFormat.h
# Opt level: O3

string * brynet::net::WebSocketFormat::wsHandshake(string *__return_storage_ptr__,string *secKey)

{
  string base64Str;
  uchar puDest [20];
  CSHA1 s1;
  string local_118;
  uchar local_f8 [24];
  CSHA1 local_e0;
  
  std::__cxx11::string::append((char *)secKey);
  CSHA1::CSHA1(&local_e0);
  CSHA1::Update(&local_e0,(uchar *)(secKey->_M_dataplus)._M_p,(uint)secKey->_M_string_length);
  CSHA1::Final(&local_e0);
  CSHA1::GetHash(&local_e0,local_f8);
  base64_encode_abi_cxx11_(&local_118,local_f8,0x14);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
             ,"");
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  CSHA1::~CSHA1(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

static std::string wsHandshake(std::string secKey)
            {
                secKey.append("258EAFA5-E914-47DA-95CA-C5AB0DC85B11");

                CSHA1 s1;
                s1.Update((unsigned char*)secKey.c_str(), static_cast<unsigned int>(secKey.size()));
                s1.Final();
                unsigned char puDest[20];
                s1.GetHash(puDest);

                std::string base64Str = base64_encode((const unsigned char *)puDest, 20);

                std::string response = "HTTP/1.1 101 Switching Protocols\r\n"
                    "Upgrade: websocket\r\n"
                    "Connection: Upgrade\r\n"
                    "Sec-WebSocket-Accept: ";

                response += base64Str;
                response += "\r\n\r\n";

                return response;
            }